

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packed_func.h
# Opt level: O2

TVMRetValue __thiscall tvm::runtime::PackedFunc::operator()<>(PackedFunc *this)

{
  TVMArgs __args;
  undefined8 extraout_RDX;
  function<void_(tvm::runtime::TVMArgs,_tvm::runtime::TVMRetValue_*)> *in_RSI;
  TVMRetValue TVar1;
  int type_codes [1];
  TVMValue_conflict values [1];
  undefined1 local_34 [4];
  undefined1 *local_30;
  undefined1 *puStack_28;
  undefined4 local_20;
  uint uStack_1c;
  undefined1 local_18 [8];
  
  *(undefined4 *)((long)&(this->body_).super__Function_base._M_functor + 8) = 4;
  local_30 = local_18;
  puStack_28 = local_34;
  local_20 = 0;
  __args.type_codes = (int *)puStack_28;
  __args.values = (TVMValue_conflict *)local_30;
  __args._16_8_ = (ulong)uStack_1c << 0x20;
  std::function<void_(tvm::runtime::TVMArgs,_tvm::runtime::TVMRetValue_*)>::operator()
            (in_RSI,__args,(TVMRetValue *)this);
  TVar1.super_TVMPODValue_._8_8_ = extraout_RDX;
  TVar1.super_TVMPODValue_.value_.v_handle = this;
  return (TVMRetValue)TVar1.super_TVMPODValue_;
}

Assistant:

inline TVMRetValue PackedFunc::operator()(Args &&... args) const {
  const int kNumArgs = sizeof...(Args);
  const int kArraySize = kNumArgs > 0 ? kNumArgs : 1;
  TVMValue values[kArraySize];
  int type_codes[kArraySize];
  detail::for_each(TVMArgsSetter(values, type_codes),
                   std::forward<Args>(args)...);
  TVMRetValue rv;
  body_(TVMArgs(values, type_codes, kNumArgs), &rv);
  return rv;
}